

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall
ArgsManager::WriteSettingsFile
          (ArgsManager *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors,bool backup)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  logic_error *this_00;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  write_errors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  path path_tmp;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc8;
  path *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  path *in_stack_fffffffffffffdf8;
  undefined1 *puVar4;
  ArgsManager *in_stack_fffffffffffffe00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  path *path_00;
  bool local_162;
  undefined1 local_161 [49];
  path local_130 [2];
  undefined1 local_c8 [32];
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path((path *)in_stack_fffffffffffffdb8);
  fs::path::path((path *)in_stack_fffffffffffffdb8);
  bVar1 = GetSettingsPath(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x30,0));
  if ((bVar1) &&
     (bVar1 = GetSettingsPath(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                              SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0),
                              SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x30,0)), bVar1)) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdb8);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdf8,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffddc,SUB41((uint)in_stack_fffffffffffffdd8 >> 0x18,0));
    path_00 = local_130;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffdb8);
    bVar1 = common::WriteSettings
                      (path_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                *)CONCAT17(in_stack_fffffffffffffe17,
                                           CONCAT16(in_stack_fffffffffffffe16,
                                                    in_stack_fffffffffffffe10)),
                       in_stack_fffffffffffffe08);
    if (bVar1) {
      fs::path::path((path *)in_stack_fffffffffffffdb8,(path *)0x16ea93);
      fs::path::path((path *)in_stack_fffffffffffffdb8,(path *)0x16eaaa);
      bVar1 = RenameOver((path *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                         in_stack_fffffffffffffdd0);
      bVar2 = bVar1 ^ 0xff;
      fs::path::~path((path *)in_stack_fffffffffffffdb8);
      fs::path::~path((path *)in_stack_fffffffffffffdb8);
      if ((bVar2 & 1) == 0) {
        local_162 = true;
      }
      else {
        fs::PathToString_abi_cxx11_
                  ((path *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
        fs::PathToString_abi_cxx11_
                  ((path *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffde8);
        puVar4 = local_161;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffdb8);
        __l._M_len = (size_type)puVar4;
        __l._M_array = (iterator)in_stack_fffffffffffffe00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffdf8,__l,(allocator_type *)in_stack_fffffffffffffdf0);
        SaveErrors((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffdc8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffdb8);
        puVar4 = local_c8;
        puVar3 = local_a8;
        do {
          puVar3 = puVar3 + -0x20;
          std::__cxx11::string::~string(in_stack_fffffffffffffdb8);
        } while (puVar3 != puVar4);
        std::__cxx11::string::~string(in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffdb8);
        local_162 = false;
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe17,
                           CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
               in_stack_fffffffffffffe08);
      SaveErrors((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdc8);
      local_162 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffdc8);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdb8);
    fs::path::~path((path *)in_stack_fffffffffffffdb8);
    fs::path::~path((path *)in_stack_fffffffffffffdb8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return local_162;
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Attempt to write settings file when dynamic settings are disabled.");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::WriteSettingsFile(std::vector<std::string>* errors, bool backup) const
{
    fs::path path, path_tmp;
    if (!GetSettingsPath(&path, /*temp=*/false, backup) || !GetSettingsPath(&path_tmp, /*temp=*/true, backup)) {
        throw std::logic_error("Attempt to write settings file when dynamic settings are disabled.");
    }

    LOCK(cs_args);
    std::vector<std::string> write_errors;
    if (!common::WriteSettings(path_tmp, m_settings.rw_settings, write_errors)) {
        SaveErrors(write_errors, errors);
        return false;
    }
    if (!RenameOver(path_tmp, path)) {
        SaveErrors({strprintf("Failed renaming settings file %s to %s\n", fs::PathToString(path_tmp), fs::PathToString(path))}, errors);
        return false;
    }
    return true;
}